

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int GetExpressScanDataResponseFromThreadRPLIDARx
              (RPLIDAR *pRPLIDAR,double *pDistances,double *pAngles,BOOL *pbNewScan)

{
  int iVar1;
  int local_34;
  int res;
  int id;
  BOOL *pbNewScan_local;
  double *pAngles_local;
  double *pDistances_local;
  RPLIDAR *pRPLIDAR_local;
  
  local_34 = 0;
  do {
    if ((RPLIDAR *)addrsRPLIDAR[local_34] == pRPLIDAR) {
      EnterCriticalSection(RPLIDARCS + local_34);
      memcpy(pDistances,distancesRPLIDAR + local_34,0x100);
      memcpy(pAngles,anglesRPLIDAR + local_34,0x100);
      *pbNewScan = bNewScanRPLIDAR[local_34];
      iVar1 = resRPLIDAR[local_34];
      LeaveCriticalSection(RPLIDARCS + local_34);
      return iVar1;
    }
    local_34 = local_34 + 1;
  } while (local_34 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int GetExpressScanDataResponseFromThreadRPLIDARx(RPLIDAR* pRPLIDAR, double* pDistances, double* pAngles, BOOL* pbNewScan)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&RPLIDARCS[id]);
	memcpy(pDistances, distancesRPLIDAR[id], NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
	memcpy(pAngles, anglesRPLIDAR[id], NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
	*pbNewScan = bNewScanRPLIDAR[id];
	res = resRPLIDAR[id];
	LeaveCriticalSection(&RPLIDARCS[id]);

	return res;
}